

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.c
# Opt level: O0

double inform_bin(double *series,size_t n,int b,int *binned,inform_error *err)

{
  double dVar1;
  double *pdVar2;
  ulong local_60;
  size_t i;
  double step;
  double range;
  double max;
  double min;
  inform_error *err_local;
  int *binned_local;
  size_t sStack_20;
  int b_local;
  size_t n_local;
  double *series_local;
  
  if (series == (double *)0x0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ETIMESERIES;
    }
    series_local = (double *)0x0;
  }
  else if (n == 0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ESHORTSERIES;
    }
    series_local = (double *)0x0;
  }
  else if (b < 2) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_EBIN;
    }
    series_local = (double *)0x0;
  }
  else if (binned == (int *)0x0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ETIMESERIES;
    }
    series_local = (double *)0x0;
  }
  else {
    min = (double)err;
    err_local = binned;
    binned_local._4_4_ = b;
    sStack_20 = n;
    n_local = (size_t)series;
    dVar1 = inform_range(series,n,&max,&range,err);
    pdVar2 = (double *)(dVar1 / (double)binned_local._4_4_);
    series_local = pdVar2;
    if (2.220446049250313e-15 < (double)pdVar2) {
      for (local_60 = 0; local_60 < sStack_20; local_60 = local_60 + 1) {
        dVar1 = floor((*(double *)(n_local + local_60 * 8) - max) / (double)pdVar2);
        err_local[local_60] = (int)dVar1 - (uint)(*(double *)(n_local + local_60 * 8) == range);
        if ((err_local[local_60] < INFORM_SUCCESS) || (binned_local._4_4_ <= err_local[local_60])) {
          __assert_fail("0 <= binned[i] && binned[i] < b",
                        "/workspace/llm4binary/github/license_c_cmakelists/ELIFE-ASU[P]Inform/src/utilities/binning.c"
                        ,0x36,
                        "double inform_bin(const double *, size_t, int, int *, inform_error *)");
        }
      }
    }
    else {
      memset(err_local,0,sStack_20 << 2);
      if (min != 0.0) {
        *(undefined4 *)min = 0xe;
      }
    }
  }
  return (double)series_local;
}

Assistant:

double inform_bin(double const *series, size_t n, int b, int *binned,
    inform_error *err)
{
    if (series == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0.0);
    else if (n == 0)
        INFORM_ERROR_RETURN(err, INFORM_ESHORTSERIES, 0.0);
    else if (b < 2)
        INFORM_ERROR_RETURN(err, INFORM_EBIN, 0.0);
    else if (binned == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0.0);

    double min, max;
    double range = inform_range(series, n, &min, &max, err);
    double step = range / b;

    if (step <= 10.*DBL_EPSILON)
    {
        memset(binned, 0, n*sizeof(int));
        INFORM_ERROR_RETURN(err, INFORM_EBIN, step);
    }

    for (size_t i = 0; i < n; ++i)
    {
        binned[i] = (int) floor((series[i] - min) / step) - (series[i] == max);
        assert(0 <= binned[i] && binned[i] < b);
    }

    return step;
}